

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_traits.hpp
# Opt level: O0

type jsoncons::unicode_traits::detect_json_encoding<char>(char *data,size_t length)

{
  char *in_RSI;
  char *in_RDI;
  type tVar1;
  detect_encoding_result<char> r;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *local_10;
  encoding_kind local_8;
  
  tVar1 = detect_encoding_from_bom<char>
                    (in_RSI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_10 = tVar1.ptr;
  local_8 = tVar1.encoding;
  if (local_8 == undetected) {
    local_10 = in_RDI;
    if (in_RSI < (char *)0x4) {
      local_8 = utf8;
    }
    else if (((*in_RDI == '\0') && (in_RDI[1] == '\0')) && (in_RDI[2] == '\0')) {
      local_8 = utf32be;
    }
    else if ((*in_RDI == '\0') && (in_RDI[2] == '\0')) {
      local_8 = utf16be;
    }
    else if ((in_RDI[1] == '\0') && ((in_RDI[2] == '\0' && (in_RDI[3] == '\0')))) {
      local_8 = utf32le;
    }
    else if ((in_RDI[1] == '\0') && (in_RDI[3] == '\0')) {
      local_8 = utf16le;
    }
    else {
      local_8 = utf8;
    }
  }
  tVar1.encoding = local_8;
  tVar1.ptr = local_10;
  tVar1._12_4_ = 0;
  return tVar1;
}

Assistant:

typename std::enable_if<ext_traits::is_char8<CharT>::value,detect_encoding_result<CharT>>::type
    detect_json_encoding(const CharT* data, std::size_t length)
    {
        detect_encoding_result<CharT> r = detect_encoding_from_bom(data,length);
        if (r.encoding != encoding_kind::undetected)
        {
            return r;
        }
        else if (length < 4)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf8};
        }
        else if (*data == 0 && *(data+1) == 0 && *(data+2) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf32be};
        }
        else if (*data == 0 && *(data+2) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf16be};
        }
        else if (*(data+1) == 0 && *(data+2) == 0 && *(data+3) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf32le};
        }
        else if (*(data+1) == 0 && *(data+3) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf16le};
        }
        else
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf8};
        }
    }